

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPSourceData::RTPSourceData(RTPSourceData *this,uint32_t s,RTPMemoryManager *mgr)

{
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSourceData_0013ecb0;
  (this->packetlist).super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->packetlist;
  (this->packetlist).super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->packetlist;
  (this->packetlist).super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
  _M_impl._M_node._M_size = 0;
  (this->SRinf).hasinfo = false;
  (this->RRinf).receivetime.m_t = 0.0;
  (this->RRinf).fractionlost = 0.0;
  (this->RRinf).packetslost = 0;
  (this->RRinf).exthighseqnr = 0;
  (this->RRinf).exthighseqnr = 0;
  (this->RRinf).jitter = 0;
  (this->RRinf).lsr = 0;
  (this->RRinf).dlsr = 0;
  (this->RRprevinf).receivetime.m_t = 0.0;
  (this->RRprevinf).hasinfo = false;
  (this->RRprevinf).fractionlost = 0.0;
  (this->RRprevinf).packetslost = 0;
  (this->RRprevinf).exthighseqnr = 0;
  (this->RRprevinf).exthighseqnr = 0;
  (this->RRprevinf).jitter = 0;
  (this->RRprevinf).lsr = 0;
  (this->RRprevinf).dlsr = 0;
  (this->stats).sentdata = false;
  (this->stats).probation = 0;
  (this->stats).packetsreceived = 0;
  (this->stats).numcycles = 0;
  (this->stats).baseseqnr = 0;
  (this->stats).exthighseqnr = 0;
  (this->stats).prevexthighseqnr = 0;
  (this->stats).jitter = 0;
  *(undefined8 *)&(this->stats).prevtimestamp = 0;
  *(undefined8 *)((long)&(this->stats).djitter + 4) = 0;
  *(undefined8 *)((long)&(this->stats).prevpacktime.m_t + 4) = 0;
  *(undefined8 *)((long)&(this->stats).lastmsgtime.m_t + 4) = 0;
  *(undefined8 *)((long)&(this->stats).lastrtptime.m_t + 4) = 0;
  *(undefined8 *)((long)&(this->stats).lastnotetime.m_t + 2) = 0;
  *(undefined8 *)((long)&(this->stats).numnewpackets + 2) = 0;
  *(undefined8 *)((long)&(this->SRinf).packetcount + 1) = 0;
  *(undefined8 *)((long)&(this->SRinf).receivetime.m_t + 1) = 0;
  (this->SRinf).ntptimestamp.msw = 0;
  (this->SRinf).ntptimestamp.lsw = 0;
  (this->SRinf).rtptimestamp = 0;
  (this->SRinf).packetcount = 0;
  *(undefined8 *)((long)&(this->SRprevinf).packetcount + 1) = 0;
  *(undefined8 *)((long)&(this->SRprevinf).receivetime.m_t + 1) = 0;
  (this->SRprevinf).ntptimestamp.msw = 0;
  (this->SRprevinf).ntptimestamp.lsw = 0;
  (this->SRprevinf).rtptimestamp = 0;
  (this->SRprevinf).packetcount = 0;
  RTCPSDESInfo::RTCPSDESInfo(&this->SDESinf,mgr);
  (this->byetime).m_t = 0.0;
  this->ssrc = s;
  this->issender = false;
  this->timestampunit = -1.0;
  this->receivedbye = false;
  this->ownssrc = false;
  this->iscsrc = false;
  this->validated = false;
  this->processedinrtcp = false;
  this->isrtpaddrset = false;
  this->isrtcpaddrset = false;
  this->rtpaddr = (RTPAddress *)0x0;
  this->rtcpaddr = (RTPAddress *)0x0;
  this->byereason = (uint8_t *)0x0;
  this->byereasonlen = 0;
  return;
}

Assistant:

RTPSourceData::RTPSourceData(uint32_t s, RTPMemoryManager *mgr) : RTPMemoryObject(mgr),SDESinf(mgr),byetime(0,0)
{
	ssrc = s;
	issender = false;
	iscsrc = false;
	timestampunit = -1;
	receivedbye = false;
	byereason = 0;
	byereasonlen = 0;
	rtpaddr = 0;
	rtcpaddr = 0;
	ownssrc = false;
	validated = false;
	processedinrtcp = false;			
	isrtpaddrset = false;
	isrtcpaddrset = false;
}